

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::SPxSolverBase<double>::getPrimalSol
          (SPxSolverBase<double> *this,VectorBase<double> *p_vector)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  Status SVar4;
  Representation RVar5;
  int iVar6;
  Status SVar7;
  undefined8 uVar8;
  double *pdVar9;
  SPxLPBase<double> *in_RSI;
  SPxSolverBase<double> *in_RDI;
  int j;
  int i;
  Desc *ds;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  SPxLPBase<double> *in_stack_ffffffffffffff00;
  SPxSolverBase<double> *in_stack_ffffffffffffff08;
  DataKey local_a0;
  SPxColId local_98;
  DataKey local_90;
  int local_88;
  undefined1 local_82;
  allocator local_81;
  string local_80 [36];
  int local_5c;
  Desc *local_58;
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  SPxLPBase<double> *local_18;
  Status local_4;
  
  local_18 = in_RSI;
  bVar3 = isInitialized(in_RDI);
  if (bVar3) {
    RVar5 = rep(in_RDI);
    if (RVar5 == ROW) {
      coPvec(in_RDI);
      VectorBase<double>::operator=
                ((VectorBase<double> *)in_stack_ffffffffffffff00,
                 (VectorBase<double> *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                );
    }
    else {
      local_58 = SPxBasisBase<double>::desc(&in_RDI->super_SPxBasisBase<double>);
      for (local_5c = 0; iVar2 = local_5c,
          iVar6 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x24d239), iVar2 < iVar6;
          local_5c = local_5c + 1) {
        SVar7 = SPxBasisBase<double>::Desc::colStatus
                          ((Desc *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
        switch(SVar7) {
        case D_FREE:
        case D_ON_UPPER:
        case D_ON_LOWER:
        case D_ON_BOTH:
        case D_UNDEFINED:
          break;
        case P_FIXED:
        case P_ON_UPPER:
          pdVar9 = SPxLPBase<double>::upper(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          dVar1 = *pdVar9;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffefc);
          *pdVar9 = dVar1;
          break;
        default:
          local_82 = 1;
          uVar8 = __cxa_allocate_exception(0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_80,"XSOLVE07 This should never happen.",&local_81);
          SPxInternalCodeException::SPxInternalCodeException
                    ((SPxInternalCodeException *)in_stack_ffffffffffffff00,
                     (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          local_82 = 0;
          __cxa_throw(uVar8,&SPxInternalCodeException::typeinfo,
                      SPxInternalCodeException::~SPxInternalCodeException);
        case P_ON_LOWER:
          pdVar9 = SPxLPBase<double>::lower(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
          dVar1 = *pdVar9;
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffefc);
          *pdVar9 = dVar1;
          break;
        case P_FREE:
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffefc);
          *pdVar9 = 0.0;
        }
      }
      for (local_88 = 0; iVar2 = local_88, iVar6 = dim((SPxSolverBase<double> *)0x24d438),
          iVar2 < iVar6; local_88 = local_88 + 1) {
        local_90 = (DataKey)SPxBasisBase<double>::baseId
                                      ((SPxBasisBase<double> *)
                                       CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                                       ,0);
        bVar3 = SPxId::isSPxColId((SPxId *)&local_90);
        if (bVar3) {
          fVec(in_RDI);
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffefc);
          in_stack_ffffffffffffff08 = (SPxSolverBase<double> *)*pdVar9;
          in_stack_ffffffffffffff00 = local_18;
          local_a0 = (DataKey)SPxBasisBase<double>::baseId
                                        ((SPxBasisBase<double> *)
                                         CONCAT44(in_stack_fffffffffffffefc,
                                                  in_stack_fffffffffffffef8),0);
          SPxColId::SPxColId(&local_98,(SPxId *)&local_a0);
          SPxLPBase<double>::number
                    (in_stack_ffffffffffffff00,
                     (SPxColId *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          pdVar9 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffefc);
          *pdVar9 = (double)in_stack_ffffffffffffff08;
        }
      }
    }
    local_4 = status(in_stack_ffffffffffffff08);
  }
  else {
    SVar4 = status(in_stack_ffffffffffffff08);
    if (SVar4 != NO_PROBLEM) {
      local_4d = 1;
      uVar8 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,"XSOLVE06 Not Initialized",&local_39);
      SPxStatusException::SPxStatusException
                ((SPxStatusException *)in_stack_ffffffffffffff00,
                 (string *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      local_4d = 0;
      __cxa_throw(uVar8,&SPxStatusException::typeinfo,SPxStatusException::~SPxStatusException);
    }
    local_4 = status(in_stack_ffffffffffffff08);
  }
  return local_4;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::getPrimalSol(VectorBase<R>& p_vector) const
{

   if(!isInitialized())
   {
      /* exit if presolving/simplifier cleared the problem */
      if(status() == NO_PROBLEM)
         return status();

      throw SPxStatusException("XSOLVE06 Not Initialized");
   }

   if(rep() == ROW)
      p_vector = coPvec();
   else
   {
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      for(int i = 0; i < this->nCols(); ++i)
      {
         switch(ds.colStatus(i))
         {
         case SPxBasisBase<R>::Desc::P_ON_LOWER :
            p_vector[i] = SPxLPBase<R>::lower(i);
            break;

         case SPxBasisBase<R>::Desc::P_ON_UPPER :
         case SPxBasisBase<R>::Desc::P_FIXED :
            p_vector[i] = SPxLPBase<R>::upper(i);
            break;

         case SPxBasisBase<R>::Desc::P_FREE :
            p_vector[i] = 0;
            break;

         case SPxBasisBase<R>::Desc::D_FREE :
         case SPxBasisBase<R>::Desc::D_ON_UPPER :
         case SPxBasisBase<R>::Desc::D_ON_LOWER :
         case SPxBasisBase<R>::Desc::D_ON_BOTH :
         case SPxBasisBase<R>::Desc::D_UNDEFINED :
            break;

         default:
            throw SPxInternalCodeException("XSOLVE07 This should never happen.");
         }
      }

      for(int j = 0; j < dim(); ++j)
      {
         if(this->baseId(j).isSPxColId())
            p_vector[ this->number(SPxColId(this->baseId(j))) ] = fVec()[j];
      }
   }

   return status();
}